

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O1

void __thiscall Buffer::prepend(Buffer *this,byte *data,usize size)

{
  EVP_PKEY_CTX *pEVar1;
  byte *pbVar2;
  Memory *pMVar3;
  EVP_PKEY_CTX *src;
  
  pbVar2 = this->buffer;
  if ((pbVar2 != (byte *)0x0) && (size <= (ulong)((long)this->bufferStart - (long)pbVar2))) {
    pMVar3 = (Memory *)(this->bufferStart + -size);
    this->bufferStart = (byte *)pMVar3;
    Memory::copy(pMVar3,(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
    return;
  }
  src = (EVP_PKEY_CTX *)(this->bufferEnd + -(long)this->bufferStart);
  pEVar1 = src + size;
  if ((pbVar2 == (byte *)0x0) || ((EVP_PKEY_CTX *)this->_capacity < pEVar1)) {
    this->_capacity = (usize)pEVar1;
    pMVar3 = (Memory *)operator_new__((ulong)(pEVar1 + 1));
    Memory::copy(pMVar3,(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
    Memory::copy(pMVar3 + size,(EVP_PKEY_CTX *)this->bufferStart,src);
    if (this->buffer != (byte *)0x0) {
      operator_delete__(this->buffer);
    }
    this->buffer = (byte *)pMVar3;
  }
  else {
    Memory::move(pbVar2 + size,this->bufferStart,(usize)src);
    Memory::copy((Memory *)this->buffer,(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
    pMVar3 = (Memory *)this->buffer;
  }
  this->bufferStart = (byte *)pMVar3;
  this->bufferEnd = (byte *)(pEVar1 + (long)pMVar3);
  return;
}

Assistant:

void prepend(const byte* data, usize size)
  {
    if(buffer && (usize)(bufferStart - buffer) >= size)
    {
      bufferStart -= size;
      Memory::copy(bufferStart, data, size);
      return;
    }
    usize oldSize = bufferEnd - bufferStart;
    usize requiredCapacity = size + oldSize;
    if(buffer && _capacity >= requiredCapacity)
    {
      Memory::move(buffer + size, bufferStart, oldSize);
      Memory::copy(buffer, data, size);
      bufferStart = buffer;
      bufferEnd = buffer + requiredCapacity;
    }
    else
    {
        _capacity = requiredCapacity;
      byte* newBuffer = (byte*)new char[requiredCapacity + 1];
      Memory::copy(newBuffer, data, size);
      Memory::copy(newBuffer + size, bufferStart, oldSize);
      delete [] (char*)buffer;
      bufferStart = buffer = newBuffer;
      bufferEnd = newBuffer+ requiredCapacity;
    }
  }